

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O2

FT_Error ps_table_add(PS_Table table,FT_Int idx,void *object,FT_UInt length)

{
  ulong uVar1;
  FT_Memory memory;
  FT_Error FVar2;
  FT_Byte *__dest;
  ulong uVar3;
  ulong uVar4;
  FT_Offset FVar5;
  ulong uVar6;
  FT_Byte *old_base;
  ulong __n;
  ulong size;
  int local_34 [2];
  FT_Error error;
  
  FVar2 = 6;
  if ((-1 < idx) && (idx < table->max_elems)) {
    old_base = table->block;
    FVar5 = table->cursor;
    __n = (ulong)length;
    uVar1 = table->capacity;
    if (uVar1 < FVar5 + __n) {
      uVar3 = (long)object - (long)old_base;
      size = uVar1;
      uVar4 = 0xffffffffffffffff;
      if (-1 < (long)uVar3) {
        uVar4 = uVar3;
      }
      for (; size < FVar5 + __n; size = size + (size >> 2) + 0x400 & 0xfffffffffffffc00) {
      }
      uVar6 = 0xffffffffffffffff;
      if (uVar3 < uVar1) {
        uVar6 = uVar4;
      }
      memory = table->memory;
      __dest = (FT_Byte *)ft_mem_alloc(memory,size,local_34);
      table->block = __dest;
      if (local_34[0] != 0) {
        table->block = old_base;
        return local_34[0];
      }
      if (old_base != (FT_Byte *)0x0) {
        memcpy(__dest,old_base,table->capacity);
        shift_elements(table,old_base);
        ft_mem_free(memory,old_base);
      }
      table->capacity = size;
      if (-1 < (long)uVar6) {
        object = table->block + uVar6;
      }
      old_base = table->block;
      FVar5 = table->cursor;
    }
    table->elements[(uint)idx] = old_base + FVar5;
    table->lengths[(uint)idx] = length;
    memcpy(table->block + FVar5,object,__n);
    table->cursor = table->cursor + __n;
    FVar2 = 0;
  }
  return FVar2;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  ps_table_add( PS_Table  table,
                FT_Int    idx,
                void*     object,
                FT_UInt   length )
  {
    if ( idx < 0 || idx >= table->max_elems )
    {
      FT_ERROR(( "ps_table_add: invalid index\n" ));
      return FT_THROW( Invalid_Argument );
    }

    /* grow the base block if needed */
    if ( table->cursor + length > table->capacity )
    {
      FT_Error    error;
      FT_Offset   new_size = table->capacity;
      FT_PtrDist  in_offset;


      in_offset = (FT_Byte*)object - table->block;
      if ( in_offset < 0 || (FT_Offset)in_offset >= table->capacity )
        in_offset = -1;

      while ( new_size < table->cursor + length )
      {
        /* increase size by 25% and round up to the nearest multiple
           of 1024 */
        new_size += ( new_size >> 2 ) + 1;
        new_size  = FT_PAD_CEIL( new_size, 1024 );
      }

      error = reallocate_t1_table( table, new_size );
      if ( error )
        return error;

      if ( in_offset >= 0 )
        object = table->block + in_offset;
    }

    /* add the object to the base block and adjust offset */
    table->elements[idx] = table->block + table->cursor;
    table->lengths [idx] = length;
    FT_MEM_COPY( table->block + table->cursor, object, length );

    table->cursor += length;
    return FT_Err_Ok;
  }